

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.h
# Opt level: O3

void __thiscall
Iir::PoleFilter<Iir::ChebyshevI::HighPassBase,_Iir::DirectFormII,_3,_3>::PoleFilter
          (PoleFilter<Iir::ChebyshevI::HighPassBase,_Iir::DirectFormII,_3,_3> *this)

{
  undefined8 *puVar1;
  long lVar2;
  Storage local_30;
  
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_numPoles = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_maxPoles = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_pair = (PoleZeroPair *)0x0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.super_Cascade.m_numStages = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.super_Cascade.m_maxStages = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.super_Cascade.m_stageArray = (Biquad *)0x0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_normalW = 0.0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_normalGain = 1.0;
  ChebyshevI::AnalogLowPass::AnalogLowPass
            (&(this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
              m_analogProto);
  local_30.stageArray = (this->super_CascadeStages<2,_Iir::DirectFormII>).m_stages;
  lVar2 = 0x60;
  do {
    *(undefined8 *)((long)((this->super_CascadeStages<2,_Iir::DirectFormII>).m_stages + -2) + lVar2)
         = 0x3ff0000000000000;
    puVar1 = (undefined8 *)
             ((long)(this->super_CascadeStages<2,_Iir::DirectFormII>).m_stages + lVar2 + -0x58);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(this->super_CascadeStages<2,_Iir::DirectFormII>).m_stages + lVar2 + -0x48);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)(this->super_CascadeStages<2,_Iir::DirectFormII>).m_stages + lVar2 + -0x38) =
         0x3ff0000000000000;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0xc0);
  memset((this->super_CascadeStages<2,_Iir::DirectFormII>).m_states,0,0x120);
  local_30.maxStages = 2;
  Cascade::setCascadeStorage((Cascade *)this,&local_30);
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_numPoles = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_maxPoles = 3;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_pair = (this->m_analogStorage).m_pairs;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_numPoles = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_maxPoles = 3;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_pair = (this->m_digitalStorage).m_pairs;
  *(undefined4 *)
   &(this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalW = 0;
  *(undefined4 *)
   ((long)&(this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalW + 4) = 0;
  *(undefined4 *)
   &(this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalGain = 0;
  *(undefined4 *)
   ((long)&(this->super_HighPassBase).super_PoleFilterBase<Iir::ChebyshevI::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalGain + 4) = 0x3ff00000;
  (this->super_CascadeStages<2,_Iir::DirectFormII>).m_states[0].m_v1 = 0.0;
  (this->super_CascadeStages<2,_Iir::DirectFormII>).m_states[0].m_v2 = 0.0;
  (this->super_CascadeStages<2,_Iir::DirectFormII>).m_states[1].m_v1 = 0.0;
  (this->super_CascadeStages<2,_Iir::DirectFormII>).m_states[1].m_v2 = 0.0;
  return;
}

Assistant:

PoleFilter ()
			{
				// This glues together the factored base classes
				// with the templatized storage classes.
				BaseClass::setCascadeStorage (this->getCascadeStorage());
				BaseClass::setPrototypeStorage (m_analogStorage, m_digitalStorage);
				CascadeStages<(MaxDigitalPoles + 1) / 2 , StateType>::reset();
			}